

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative_entropy.c
# Opt level: O3

double * inform_local_relative_entropy(int *xs,int *ys,size_t n,int b,double *re,inform_error *err)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  _Bool _Var3;
  inform_dist *dist;
  inform_dist *dist_00;
  size_t sVar4;
  size_t n_00;
  double dVar5;
  double *local_50;
  
  _Var3 = check_arguments(xs,ys,n,b,err);
  if (!_Var3) {
    local_50 = re;
    if ((re == (double *)0x0) && (local_50 = (double *)malloc(n * 8), local_50 == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      n_00 = (size_t)b;
      dist = inform_dist_alloc(n_00);
      if (dist != (inform_dist *)0x0) {
        dist_00 = inform_dist_alloc(n_00);
        if (dist_00 != (inform_dist *)0x0) {
          dist->counts = n;
          dist_00->counts = n;
          if (n != 0) {
            puVar1 = dist->histogram;
            puVar2 = dist_00->histogram;
            sVar4 = 0;
            do {
              puVar1[xs[sVar4]] = puVar1[xs[sVar4]] + 1;
              puVar2[ys[sVar4]] = puVar2[ys[sVar4]] + 1;
              sVar4 = sVar4 + 1;
            } while (n != sVar4);
          }
          if (b != 0) {
            sVar4 = 0;
            do {
              dVar5 = log2((double)dist->histogram[sVar4] / (double)dist_00->histogram[sVar4]);
              local_50[sVar4] = dVar5;
              sVar4 = sVar4 + 1;
            } while (n_00 != sVar4);
          }
          inform_dist_free(dist);
          inform_dist_free(dist_00);
          return local_50;
        }
        inform_dist_free(dist);
      }
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      if (re == (double *)0x0) {
        free(local_50);
      }
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_relative_entropy(int const *xs, int const *ys, size_t n,
    int b, double *re, inform_error *err)
{
    if (check_arguments(xs, ys, n, b, err)) return NULL;

    bool allocate_re = (re == NULL);
    if (allocate_re)
    {
        re = malloc(n * sizeof(double));
        if (re == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *y = NULL;
    if (allocate(b, &x, &y, err))
    {
        if (allocate_re) free(re);
        return NULL;
    }

    accumulate(xs, ys, n, x, y);

    double p, q;
    for (size_t i = 0; i < (size_t) b; ++i)
    {
        p = x->histogram[i];
        q = y->histogram[i];
        re[i] = log2(p / q);
    }

    free_all(&x, &y);

    return re;
}